

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16to1.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel_pack16to1_avx512
               (Mat *kernel,Mat *kernel_tm_packed,int inch,int outch,Option *opt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int *piVar11;
  undefined1 auVar12 [64];
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  _func_int ***ppp_Var18;
  ulong uVar19;
  undefined8 *puVar20;
  _func_int ***ppp_Var21;
  _func_int ***ppp_Var22;
  Allocator *pAVar23;
  long lVar24;
  _func_int ***ppp_Var25;
  ulong uVar26;
  int k;
  Allocator *pAVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  Allocator *pAVar32;
  int j;
  long lVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  float tmp [8] [3];
  Mat local_f8;
  ulong local_a8;
  long local_a0;
  undefined1 local_98 [64];
  undefined1 local_58 [32];
  
  uVar31 = (ulong)(uint)outch;
  local_f8.cstep = 0;
  local_f8.data = (Allocator *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elempack = 0;
  local_f8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_f8.elemsize._4_4_ = (int)local_f8.refcount;
  local_f8.allocator = (Allocator *)local_f8.data;
  local_f8.dims = (int)local_f8.refcount;
  local_f8.w = local_f8.refcount._4_4_;
  local_f8.c = local_f8.elempack;
  Mat::create(&local_f8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar12 = _DAT_0054edc0;
  if (0 < outch) {
    pvVar3 = kernel->data;
    auVar37 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fdc0),_DAT_0054f600,_DAT_0054f640);
    auVar38 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fde0),_DAT_0054f600,_DAT_0054f640);
    auVar39 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fe00),_DAT_0054f600,_DAT_0054f640);
    uVar26 = 0;
    auVar45 = ZEXT3264(_DAT_0054fe20);
    pAVar23 = (Allocator *)local_f8.data;
    do {
      if (0 < inch) {
        iVar14 = inch * 9 * (int)uVar26;
        uVar28 = 0;
        pAVar27 = pAVar23;
        do {
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          auVar42 = auVar37._0_32_;
          auVar34 = vmulps_avx512vl(auVar42,auVar34);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 4);
          auVar35._4_4_ = uVar1;
          auVar35._0_4_ = uVar1;
          auVar35._8_4_ = uVar1;
          auVar35._12_4_ = uVar1;
          auVar35._16_4_ = uVar1;
          auVar35._20_4_ = uVar1;
          auVar35._24_4_ = uVar1;
          auVar35._28_4_ = uVar1;
          auVar43 = auVar38._0_32_;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar43,auVar35);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 8);
          auVar36._4_4_ = uVar1;
          auVar36._0_4_ = uVar1;
          auVar36._8_4_ = uVar1;
          auVar36._12_4_ = uVar1;
          auVar36._16_4_ = uVar1;
          auVar36._20_4_ = uVar1;
          auVar36._24_4_ = uVar1;
          auVar36._28_4_ = uVar1;
          auVar44 = auVar39._0_32_;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar44,auVar36);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0xc);
          auVar7._4_4_ = uVar1;
          auVar7._0_4_ = uVar1;
          auVar7._8_4_ = uVar1;
          auVar7._12_4_ = uVar1;
          auVar7._16_4_ = uVar1;
          auVar7._20_4_ = uVar1;
          auVar7._24_4_ = uVar1;
          auVar7._28_4_ = uVar1;
          auVar35 = vmulps_avx512vl(auVar42,auVar7);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x10);
          auVar8._4_4_ = uVar1;
          auVar8._0_4_ = uVar1;
          auVar8._8_4_ = uVar1;
          auVar8._12_4_ = uVar1;
          auVar8._16_4_ = uVar1;
          auVar8._20_4_ = uVar1;
          auVar8._24_4_ = uVar1;
          auVar8._28_4_ = uVar1;
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar43,auVar8);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x14);
          auVar9._4_4_ = uVar1;
          auVar9._0_4_ = uVar1;
          auVar9._8_4_ = uVar1;
          auVar9._12_4_ = uVar1;
          auVar9._16_4_ = uVar1;
          auVar9._20_4_ = uVar1;
          auVar9._24_4_ = uVar1;
          auVar9._28_4_ = uVar1;
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar44,auVar9);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x18);
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar10._16_4_ = uVar1;
          auVar10._20_4_ = uVar1;
          auVar10._24_4_ = uVar1;
          auVar10._28_4_ = uVar1;
          auVar36 = vmulps_avx512vl(auVar42,auVar10);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x1c);
          auVar42._4_4_ = uVar1;
          auVar42._0_4_ = uVar1;
          auVar42._8_4_ = uVar1;
          auVar42._12_4_ = uVar1;
          auVar42._16_4_ = uVar1;
          auVar42._20_4_ = uVar1;
          auVar42._24_4_ = uVar1;
          auVar42._28_4_ = uVar1;
          auVar36 = vfmadd231ps_avx512vl(auVar36,auVar43,auVar42);
          uVar1 = *(undefined4 *)((long)pvVar3 + uVar28 * 0x24 + (long)iVar14 * 4 + 0x20);
          auVar43._4_4_ = uVar1;
          auVar43._0_4_ = uVar1;
          auVar43._8_4_ = uVar1;
          auVar43._12_4_ = uVar1;
          auVar43._16_4_ = uVar1;
          auVar43._20_4_ = uVar1;
          auVar43._24_4_ = uVar1;
          auVar43._28_4_ = uVar1;
          auVar36 = vfmadd231ps_avx512vl(auVar36,auVar44,auVar43);
          auVar40 = vinsertf64x4_avx512f(ZEXT3264(auVar34),auVar35,1);
          auVar41 = vpermt2ps_avx512f(auVar40,auVar45,ZEXT3264(auVar36));
          local_98 = vpermt2ps_avx512f(auVar40,auVar12,ZEXT3264(auVar36));
          local_58 = auVar41._0_32_;
          lVar33 = 0;
          pAVar32 = pAVar27;
          do {
            uVar13 = *(uint *)(local_98 + lVar33 * 0xc);
            uVar2 = *(undefined8 *)(local_98 + lVar33 * 0xc + 4);
            puVar20 = &DAT_0054f604;
            lVar15 = 0;
            do {
              auVar46._0_4_ = (float)*puVar20 * (float)uVar2;
              auVar46._4_4_ = (float)((ulong)*puVar20 >> 0x20) * (float)((ulong)uVar2 >> 0x20);
              auVar46._8_8_ = 0;
              auVar6 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar20 + -4)),auVar46,
                                       ZEXT416(uVar13));
              auVar46 = vmovshdup_avx(auVar46);
              *(float *)((long)&pAVar32->_vptr_Allocator + lVar15 * 4) =
                   auVar6._0_4_ + auVar46._0_4_;
              lVar15 = lVar15 + 1;
              puVar20 = (undefined8 *)((long)puVar20 + 0xc);
            } while (lVar15 != 8);
            lVar33 = lVar33 + 1;
            pAVar32 = pAVar32 + 4;
          } while (lVar33 != 8);
          uVar28 = uVar28 + 1;
          pAVar27 = (Allocator *)
                    ((long)&pAVar27->_vptr_Allocator +
                    (long)local_f8.w *
                    CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
        } while (uVar28 != (uint)inch);
      }
      uVar26 = uVar26 + 1;
      pAVar23 = (Allocator *)
                ((long)&pAVar23->_vptr_Allocator +
                local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    } while (uVar26 != uVar31);
  }
  uVar13 = outch + 7;
  if (-1 < outch) {
    uVar13 = outch;
  }
  local_a8 = uVar31;
  Mat::create(kernel_tm_packed,inch,0x40,(((int)uVar13 >> 3) - (uVar13 & 0xfffffff8)) + outch,0x20,8
              ,(Allocator *)0x0);
  uVar26 = 0;
  if (7 < outch) {
    iVar14 = kernel_tm_packed->w;
    pvVar3 = kernel_tm_packed->data;
    sVar4 = kernel_tm_packed->elemsize;
    local_a0 = kernel_tm_packed->cstep * sVar4;
    uVar28 = 0;
    do {
      lVar15 = local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      ppp_Var22 = (_func_int ***)((long)(_func_int ***)local_f8.data + lVar15 * uVar28);
      lVar33 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      lVar29 = 0;
      do {
        if (0xf < inch) {
          lVar16 = (long)pvVar3 + (long)iVar14 * sVar4 * lVar29 + (uVar28 >> 3) * local_a0;
          ppp_Var25 = ppp_Var22;
          lVar30 = 0;
          do {
            lVar24 = 0;
            ppp_Var21 = ppp_Var25;
            do {
              lVar17 = lVar16;
              lVar16 = 0;
              ppp_Var18 = ppp_Var21;
              do {
                *(undefined4 *)(lVar17 + lVar16) = *(undefined4 *)ppp_Var18;
                ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar15);
                lVar16 = lVar16 + 4;
              } while (lVar16 != 0x20);
              lVar24 = lVar24 + 1;
              ppp_Var21 = (_func_int ***)((long)ppp_Var21 + lVar33);
              lVar16 = lVar17 + 0x20;
            } while (lVar24 != 0x10);
            lVar24 = lVar30 + 0x1f;
            ppp_Var25 = ppp_Var25 + lVar33 * 2;
            lVar16 = lVar17 + 0x20;
            lVar30 = lVar30 + 0x10;
          } while (lVar24 < inch);
        }
        lVar29 = lVar29 + 1;
        ppp_Var22 = (_func_int ***)((long)ppp_Var22 + 4);
      } while (lVar29 != 0x40);
      uVar26 = uVar28 + 8;
      uVar19 = uVar28 + 0xf;
      uVar28 = uVar26;
    } while (uVar19 < uVar31);
    outch = (int)local_a8;
  }
  if ((int)uVar26 < outch) {
    iVar14 = kernel_tm_packed->w;
    sVar4 = kernel_tm_packed->elemsize;
    sVar5 = kernel_tm_packed->cstep;
    uVar26 = uVar26 & 0xffffffff;
    lVar15 = local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    ppp_Var22 = (_func_int ***)((long)(_func_int ***)local_f8.data + lVar15 * uVar26);
    pvVar3 = kernel_tm_packed->data;
    lVar33 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    do {
      lVar29 = 0;
      ppp_Var25 = ppp_Var22;
      do {
        if (0xf < inch) {
          lVar30 = (long)pvVar3 +
                   (long)iVar14 * sVar4 * lVar29 +
                   (ulong)(((uint)uVar26 & 7) + ((uint)(uVar26 >> 3) & 0x1fffffff)) * sVar5 * sVar4;
          lVar16 = 0;
          ppp_Var21 = ppp_Var25;
          do {
            lVar24 = 0;
            ppp_Var18 = ppp_Var21;
            do {
              *(undefined4 *)(lVar30 + lVar24) = *(undefined4 *)ppp_Var18;
              ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar33);
              lVar24 = lVar24 + 4;
            } while (lVar24 != 0x40);
            lVar24 = lVar16 + 0x1f;
            ppp_Var21 = ppp_Var21 + lVar33 * 2;
            lVar30 = lVar30 + 0x40;
            lVar16 = lVar16 + 0x10;
          } while (lVar24 < inch);
        }
        lVar29 = lVar29 + 1;
        ppp_Var25 = (_func_int ***)((long)ppp_Var25 + 4);
      } while (lVar29 != 0x40);
      uVar26 = uVar26 + 1;
      ppp_Var22 = (_func_int ***)((long)ppp_Var22 + lVar15);
    } while (uVar26 != uVar31);
  }
  piVar11 = (int *)CONCAT44(local_f8.refcount._4_4_,(int)local_f8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_f8.data != (Allocator *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(const Mat& kernel, Mat& kernel_tm_packed, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 16a-inch/16a-64-outch;
    kernel_tm_packed.create(16 * inch / 16, 64, outch / 8 + outch % 8, (size_t)4u * 8, 8);

    int p = 0;
    for (; p + 7 < outch; p += 8)
    {
        Mat g0 = kernel_tm_packed.channel(p / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 15 < inch; q += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(p + j).row(q + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_packed.channel(p / 8 + p % 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 15 < inch; q += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    const float* k00 = k0.row(q + i);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}